

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPClient.cpp
# Opt level: O3

string * __thiscall
TCPClient::Send(string *__return_storage_ptr__,TCPClient *this,string *hostname,string *portNumber,
               string *message)

{
  pointer pcVar1;
  TCPClient *this_00;
  string local_88;
  string local_68;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"In Linux\n",9);
  pcVar1 = (hostname->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + hostname->_M_string_length);
  pcVar1 = (portNumber->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + portNumber->_M_string_length);
  this_00 = (TCPClient *)(message->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,this_00,this_00 + message->_M_string_length);
  Sendnix(__return_storage_ptr__,this_00,&local_48,&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string TCPClient::Send(string hostname, string portNumber, string message) {
  // To be used to make it platform independent
  #ifdef __linux__
  std::cout << "In Linux\n";
  #elif _WIN32
  std::cout << "In Windows\n";
  #elif __APPLE__
  std::cout << "Mac Os X\n";
  #else
  std::cout << "Unknown system \n";
  #endif

  // Select the correct platform
  #ifdef __linux__
    return this->Sendnix(hostname, portNumber, message);
  #elif __APPLE__
    return this->Sendnix(hostname, portNumber, message);
  #elif _WIN32
    return this->SendWin(hostname, portNumber, message);
  #endif
}